

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.h
# Opt level: O3

gc_heap_ptr<mjs::gc_string> __thiscall
mjs::gc_heap::
allocate_and_construct<mjs::gc_string,std::basic_string_view<wchar_t,std::char_traits<wchar_t>>const&>
          (gc_heap *this,size_t num_bytes,
          basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *args)

{
  long lVar1;
  long *in_RCX;
  slot *psVar2;
  undefined8 extraout_RDX;
  allocation_result aVar3;
  gc_heap_ptr<mjs::gc_string> gVar4;
  
  aVar3 = allocation_context::allocate((allocation_context *)(num_bytes + 0x10),(size_t)args);
  psVar2 = aVar3.obj;
  if (*(int *)((long)psVar2 + -4) == -1) {
    lVar1 = *in_RCX;
    psVar2->new_position = (uint32_t)lVar1;
    memcpy(&(psVar2->allocation).type,(void *)in_RCX[1],lVar1 << 2);
    *(undefined4 *)((long)psVar2 + -4) = gc_type_info_registration<mjs::gc_string>::reg._40_4_;
    (this->pointers_).set_ = (gc_heap_ptr_untyped **)num_bytes;
    (this->pointers_).capacity_ = aVar3.pos;
    attach((gc_heap *)num_bytes,(gc_heap_ptr_untyped *)this);
    gVar4.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
    gVar4.super_gc_heap_ptr_untyped.heap_ = this;
    return (gc_heap_ptr<mjs::gc_string>)gVar4.super_gc_heap_ptr_untyped;
  }
  __assert_fail("a.hdr().type == uninitialized_type_index",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.h",
                0x1f9,
                "gc_heap_ptr<T> mjs::gc_heap::allocate_and_construct(size_t, Args &&...) [T = mjs::gc_string, Args = <const std::basic_string_view<wchar_t> &>]"
               );
}

Assistant:

gc_heap_ptr<T> gc_heap::allocate_and_construct(size_t num_bytes, Args&&... args) {
    auto a = alloc_context_.allocate(num_bytes);
    assert(a.hdr().type == uninitialized_type_index);
    gc_type_info_registration<T>::construct(a.obj, std::forward<Args>(args)...);
    a.hdr().type = gc_type_info_registration<T>::index();
    return gc_heap_ptr<T>{*this, a.pos};
}